

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

int __thiscall
wasm::analysis::Tuple<wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>>::joinImpl<0ul,1ul>
          (Tuple<wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>> *this,
          tuple<bool,_unsigned_int> *joinee,tuple<bool,_unsigned_int> *joiner)

{
  bool bVar1;
  uint uVar2;
  __tuple_element_t<0UL,_tuple<Bool,_Integer<unsigned_int>_>_> *this_00;
  __tuple_element_t<0UL,_tuple<bool,_unsigned_int>_> *joinee_00;
  __tuple_element_t<0UL,_tuple<bool,_unsigned_int>_> *p_Var3;
  Element *joiner_local;
  Element *joinee_local;
  Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> *this_local;
  
  this_00 = std::get<0ul,wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>>
                      ((tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> *)this);
  joinee_00 = std::get<0ul,bool,unsigned_int>(joinee);
  p_Var3 = std::get<0ul,bool,unsigned_int>(joiner);
  bVar1 = Bool::join(this_00,joinee_00,(Element)(*p_Var3 & 1));
  uVar2 = Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::joinImpl<1UL>
                    ((Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> *)this,
                     joinee,joiner);
  return bVar1 | uVar2;
}

Assistant:

int joinImpl(Element& joinee,
               const Element& joiner,
               std::index_sequence<I, Is...>) const noexcept {
    // Recursive case: join the current element and recurse to the next
    // elements.
    return std::get<I>(lattices).join(std::get<I>(joinee),
                                      std::get<I>(joiner)) |
           joinImpl(joinee, joiner, std::index_sequence<Is...>{});
  }